

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O2

void __thiscall duckdb::Connection::BeginTransaction(Connection *this)

{
  pointer pMVar1;
  allocator local_31;
  undefined1 local_30 [8];
  string local_28;
  
  ::std::__cxx11::string::string((string *)(local_30 + 8),"BEGIN TRANSACTION",&local_31);
  Query((Connection *)local_30,(string *)this);
  ::std::__cxx11::string::~string((string *)(local_30 + 8));
  pMVar1 = unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
           ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                         *)local_30);
  if ((pMVar1->super_QueryResult).super_BaseQueryResult.success != false) {
    if ((_Head_base<0UL,_duckdb::MaterializedQueryResult_*,_false>)local_30 !=
        (_Head_base<0UL,_duckdb::MaterializedQueryResult_*,_false>)0x0) {
      (*(code *)((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                ((long)&(((((original *)
                           &(((QueryResult *)local_30)->super_BaseQueryResult)._vptr_BaseQueryResult
                           )->super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr)->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_
                + 8))->_M_pi)();
    }
    return;
  }
  pMVar1 = unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
           ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                         *)local_30);
  ::std::__cxx11::string::string((string *)(local_30 + 8),anon_var_dwarf_4b0ffdd + 9,&local_31);
  BaseQueryResult::ThrowError((BaseQueryResult *)pMVar1,(string *)(local_30 + 8));
}

Assistant:

void Connection::BeginTransaction() {
	auto result = Query("BEGIN TRANSACTION");
	if (result->HasError()) {
		result->ThrowError();
	}
}